

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

SoundAnalysisPreprocessing * __thiscall
CoreML::Specification::Model::mutable_soundanalysispreprocessing(Model *this)

{
  bool bVar1;
  SoundAnalysisPreprocessing *this_00;
  Model *this_local;
  
  bVar1 = has_soundanalysispreprocessing(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_soundanalysispreprocessing(this);
    this_00 = (SoundAnalysisPreprocessing *)operator_new(0x20);
    CoreMLModels::SoundAnalysisPreprocessing::SoundAnalysisPreprocessing(this_00);
    (this->Type_).soundanalysispreprocessing_ = this_00;
  }
  return (SoundAnalysisPreprocessing *)(this->Type_).pipelineclassifier_;
}

Assistant:

inline ::CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing* Model::mutable_soundanalysispreprocessing() {
  if (!has_soundanalysispreprocessing()) {
    clear_Type();
    set_has_soundanalysispreprocessing();
    Type_.soundanalysispreprocessing_ = new ::CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.soundAnalysisPreprocessing)
  return Type_.soundanalysispreprocessing_;
}